

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O3

bool __thiscall crunch::parse_scale_params(crunch *this,crn_mipmap_params *mipmap_params)

{
  command_line_params *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  crn_uint32 cVar4;
  crn_uint32 cVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  crn_scale_mode cVar10;
  param_map_const_iterator pVar11;
  param_map_const_iterator pVar12;
  dynamic_string *other;
  uint uVar13;
  char *pcVar14;
  crn_bool cVar15;
  _Rb_tree_header *p_Var16;
  float fVar17;
  float fVar18;
  dynamic_string mode_str;
  dynamic_string local_40;
  
  this_00 = &this->m_params;
  pVar11 = crnlib::command_line_params::get_param(this_00,"rescale",0);
  p_Var16 = &(this->m_params).m_param_map._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)pVar11._M_node == p_Var16) {
    pVar12 = crnlib::command_line_params::get_param(this_00,"relrescale",0);
    if (pVar12._M_node != pVar11._M_node) {
      fVar18 = crnlib::command_line_params::get_value_as_float
                         (this_00,"relrescale",0,1.0,1.0,256.0,0);
      fVar17 = crnlib::command_line_params::get_value_as_float
                         (this_00,"relrescale",0,1.0,1.0,256.0,1);
      mipmap_params->m_scale_mode = cCRNSMRelative;
      mipmap_params->m_scale_x = fVar18;
      goto LAB_0010df12;
    }
    pVar12 = crnlib::command_line_params::get_param(this_00,"rescalemode",0);
    if (pVar12._M_node != pVar11._M_node) {
      other = crnlib::command_line_params::get_value_as_string_or_empty(this_00,"rescalemode",0,0);
      crnlib::dynamic_string::dynamic_string(&local_40,other);
      iVar2 = crnlib::dynamic_string::compare(&local_40,"nearest",false);
      if (iVar2 == 0) {
        cVar10 = cCRNSMNearestPow2;
LAB_0010e144:
        mipmap_params->m_scale_mode = cVar10;
        bVar1 = true;
      }
      else {
        iVar2 = crnlib::dynamic_string::compare(&local_40,"hi",false);
        if (iVar2 == 0) {
          cVar10 = cCRNSMNextPow2;
          goto LAB_0010e144;
        }
        iVar2 = crnlib::dynamic_string::compare(&local_40,"lo",false);
        if (iVar2 == 0) {
          cVar10 = cCRNSMLowerPow2;
          goto LAB_0010e144;
        }
        pcVar14 = "";
        if (local_40.m_pStr != (char *)0x0) {
          pcVar14 = local_40.m_pStr;
        }
        bVar1 = false;
        crnlib::console::error("Invalid rescale mode: \"%s\"",pcVar14);
      }
      if ((local_40.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_40.m_pStr + -8) ^ *(uint *)(local_40.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_40.m_pStr + -0x10);
      }
      if (!bVar1) {
        return false;
      }
    }
  }
  else {
    iVar2 = crnlib::command_line_params::get_value_as_int(this_00,"rescale",0,-1,1,0x1000,0);
    iVar3 = crnlib::command_line_params::get_value_as_int(this_00,"rescale",0,-1,1,0x1000,1);
    mipmap_params->m_scale_mode = cCRNSMAbsolute;
    mipmap_params->m_scale_x = (float)iVar2;
    fVar17 = (float)iVar3;
LAB_0010df12:
    mipmap_params->m_scale_y = fVar17;
  }
  pcVar14 = "clamp";
  cVar15 = 0;
  pVar11 = crnlib::command_line_params::get_param(this_00,"clamp",0);
  if ((_Rb_tree_header *)pVar11._M_node == p_Var16) {
    pVar11 = crnlib::command_line_params::get_param(this_00,"clampScale",0);
    if ((_Rb_tree_header *)pVar11._M_node == p_Var16) goto LAB_0010dfac;
    cVar15 = 1;
    pcVar14 = "clampscale";
  }
  cVar4 = crnlib::command_line_params::get_value_as_int(this_00,pcVar14,0,1,1,0x1000,0);
  cVar5 = crnlib::command_line_params::get_value_as_int(this_00,pcVar14,0,1,1,0x1000,1);
  mipmap_params->m_clamp_scale = cVar15;
  mipmap_params->m_clamp_width = cVar4;
  mipmap_params->m_clamp_height = cVar5;
LAB_0010dfac:
  pVar11 = crnlib::command_line_params::get_param(this_00,"window",0);
  if ((_Rb_tree_header *)pVar11._M_node != p_Var16) {
    uVar6 = crnlib::command_line_params::get_value_as_int(this_00,"window",0,0,0,0x1000,0);
    uVar7 = crnlib::command_line_params::get_value_as_int(this_00,"window",0,0,0,0x1000,1);
    uVar8 = crnlib::command_line_params::get_value_as_int(this_00,"window",0,0,0,0x1000,2);
    uVar9 = crnlib::command_line_params::get_value_as_int(this_00,"window",0,0,0,0x1000,3);
    uVar13 = uVar8;
    if (uVar6 < uVar8) {
      uVar13 = uVar6;
    }
    if (uVar8 < uVar6) {
      uVar8 = uVar6;
    }
    mipmap_params->m_window_left = uVar13;
    uVar13 = uVar9;
    if (uVar7 < uVar9) {
      uVar13 = uVar7;
    }
    mipmap_params->m_window_top = uVar13;
    mipmap_params->m_window_right = uVar8;
    if (uVar9 < uVar7) {
      uVar9 = uVar7;
    }
    mipmap_params->m_window_bottom = uVar9;
  }
  return true;
}

Assistant:

bool parse_scale_params(crn_mipmap_params& mipmap_params)
    {
        if (m_params.has_key("rescale"))
        {
            int w = m_params.get_value_as_int("rescale", 0, -1, 1, cCRNMaxLevelResolution, 0);
            int h = m_params.get_value_as_int("rescale", 0, -1, 1, cCRNMaxLevelResolution, 1);

            mipmap_params.m_scale_mode = cCRNSMAbsolute;
            mipmap_params.m_scale_x = (float)w;
            mipmap_params.m_scale_y = (float)h;
        }
        else if (m_params.has_key("relrescale"))
        {
            float w = m_params.get_value_as_float("relrescale", 0, 1, 1, 256, 0);
            float h = m_params.get_value_as_float("relrescale", 0, 1, 1, 256, 1);

            mipmap_params.m_scale_mode = cCRNSMRelative;
            mipmap_params.m_scale_x = w;
            mipmap_params.m_scale_y = h;
        }
        else if (m_params.has_key("rescalemode"))
        {
            // nearest | hi | lo

            dynamic_string mode_str(m_params.get_value_as_string_or_empty("rescalemode"));
            if (mode_str == "nearest")
            {
                mipmap_params.m_scale_mode = cCRNSMNearestPow2;
            }
            else if (mode_str == "hi")
            {
                mipmap_params.m_scale_mode = cCRNSMNextPow2;
            }
            else if (mode_str == "lo")
            {
                mipmap_params.m_scale_mode = cCRNSMLowerPow2;
            }
            else
            {
                console::error("Invalid rescale mode: \"%s\"", mode_str.get_ptr());
                return false;
            }
        }

        if (m_params.has_key("clamp"))
        {
            uint32 w = m_params.get_value_as_int("clamp", 0, 1, 1, cCRNMaxLevelResolution, 0);
            uint32 h = m_params.get_value_as_int("clamp", 0, 1, 1, cCRNMaxLevelResolution, 1);

            mipmap_params.m_clamp_scale = false;
            mipmap_params.m_clamp_width = w;
            mipmap_params.m_clamp_height = h;
        }
        else if (m_params.has_key("clampScale"))
        {
            uint32 w = m_params.get_value_as_int("clampscale", 0, 1, 1, cCRNMaxLevelResolution, 0);
            uint32 h = m_params.get_value_as_int("clampscale", 0, 1, 1, cCRNMaxLevelResolution, 1);

            mipmap_params.m_clamp_scale = true;
            mipmap_params.m_clamp_width = w;
            mipmap_params.m_clamp_height = h;
        }

        if (m_params.has_key("window"))
        {
            uint32 xl = m_params.get_value_as_int("window", 0, 0, 0, cCRNMaxLevelResolution, 0);
            uint32 yl = m_params.get_value_as_int("window", 0, 0, 0, cCRNMaxLevelResolution, 1);
            uint32 xh = m_params.get_value_as_int("window", 0, 0, 0, cCRNMaxLevelResolution, 2);
            uint32 yh = m_params.get_value_as_int("window", 0, 0, 0, cCRNMaxLevelResolution, 3);

            mipmap_params.m_window_left = math::minimum(xl, xh);
            mipmap_params.m_window_top = math::minimum(yl, yh);
            mipmap_params.m_window_right = math::maximum(xl, xh);
            mipmap_params.m_window_bottom = math::maximum(yl, yh);
        }

        return true;
    }